

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O0

string * __thiscall
helics::NetworkCore<helics::zeromq::ZmqCommsSS,(gmlc::networking::InterfaceTypes)0>::
generateLocalAddressString_abi_cxx11_
          (NetworkCore<helics::zeromq::ZmqCommsSS,_(gmlc::networking::InterfaceTypes)0> *this)

{
  undefined1 uVar1;
  bool bVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  CommsInterface *in_RDI;
  NetworkCommsInterface *in_stack_00000028;
  lock_guard<std::mutex> lock;
  string *add;
  mutex_type *in_stack_ffffffffffffff28;
  CommsInterface *__n;
  undefined7 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  __n = in_RDI;
  std::__cxx11::string::string(in_RSI);
  CLI::std::unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
  ::operator->((unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
                *)0x4b8b1f);
  uVar1 = CommsInterface::isConnected(in_RDI);
  if ((bool)uVar1) {
    CLI::std::
    unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>::
    operator->((unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
                *)0x4b8b48);
    NetworkCommsInterface::getAddress_abi_cxx11_(in_stack_00000028);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  else {
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff28);
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b8bc7);
    if ((bVar2) ||
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI), *pvVar3 != '*')) {
      gmlc::networking::makePortAddress(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_RSI + 0x70);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff48),(size_type)in_RSI,(size_type)__n);
      gmlc::networking::makePortAddress(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4b8cdd);
  }
  return (string *)__n;
}

Assistant:

std::string NetworkCore<COMMS, baseline>::generateLocalAddressString() const
{
    std::string add;
    if (CommsBroker<COMMS, CommonCore>::comms->isConnected()) {
        add = CommsBroker<COMMS, CommonCore>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CommonCore::getIdentifier();
                }
                break;
        }
    }
    return add;
}